

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_stroke_line(nk_draw_list *list,nk_vec2 a,nk_vec2 b,nk_color col,float thickness)

{
  nk_vec2 pos;
  nk_vec2 pos_00;
  float local_28;
  float fStack_24;
  
  if (0xffffff < (uint)col && list != (nk_draw_list *)0x0) {
    local_28 = b.x;
    fStack_24 = b.y;
    if (list->line_AA == NK_ANTI_ALIASING_ON) {
      nk_draw_list_path_line_to(list,a);
    }
    else {
      pos.y = a.y + -0.5;
      pos.x = a.x + -0.5;
      nk_draw_list_path_line_to(list,pos);
      local_28 = local_28 + -0.5;
      fStack_24 = fStack_24 + -0.5;
    }
    pos_00.y = fStack_24;
    pos_00.x = local_28;
    nk_draw_list_path_line_to(list,pos_00);
    nk_draw_list_path_stroke(list,col,NK_STROKE_OPEN,thickness);
    return;
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_line(struct nk_draw_list *list, struct nk_vec2 a,
struct nk_vec2 b, struct nk_color col, float thickness)
{
NK_ASSERT(list);
if (!list || !col.a) return;
if (list->line_AA == NK_ANTI_ALIASING_ON) {
nk_draw_list_path_line_to(list, a);
nk_draw_list_path_line_to(list, b);
} else {
nk_draw_list_path_line_to(list, nk_vec2_sub(a,nk_vec2(0.5f,0.5f)));
nk_draw_list_path_line_to(list, nk_vec2_sub(b,nk_vec2(0.5f,0.5f)));
}
nk_draw_list_path_stroke(list,  col, NK_STROKE_OPEN, thickness);
}